

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

char * ply_get_next_obj_info(p_ply ply,char *last)

{
  char *pcVar1;
  
  if (last != (char *)0x0) {
    pcVar1 = (char *)0x0;
    if (last + 0x400 < ply->obj_info + ply->nobj_infos * 0x400) {
      pcVar1 = last + 0x400;
    }
    return pcVar1;
  }
  return ply->obj_info;
}

Assistant:

const char *ply_get_next_obj_info(p_ply ply, const char *last) {
    assert(ply);
    if (!last) return ply->obj_info;
    last += LINESIZE;
    if (last < ply->obj_info + LINESIZE * ply->nobj_infos)
        return last;
    else
        return NULL;
}